

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysInfo.cpp
# Opt level: O1

bool __thiscall AutoSystemInfo::CheckForAtom(AutoSystemInfo *this)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar2 = *puVar1;
  uVar3 = puVar1[3];
  if (uVar2 != 0) {
    uVar3 = (uint)(uVar3 == 0x6c65746e && (puVar1[2] == 0x49656e69 && puVar1[1] == 0x756e6547));
  }
  if ((uVar3 & 1) != 0) {
    if (uVar2 != 0) {
      puVar1 = (uint *)cpuid_Version_info(1);
      uVar2 = *puVar1;
    }
    uVar2 = uVar2 & 0xfff3ff0;
    if (uVar2 < 0x30650) {
      if (uVar2 == 0x106c0) {
        return true;
      }
      if (uVar2 == 0x20660) {
        return true;
      }
      if (uVar2 == 0x20670) {
        return true;
      }
    }
    else if ((uVar2 - 0x30650 < 0x21) &&
            ((0x100010001U >> ((ulong)(uVar2 - 0x30650) & 0x3f) & 1) != 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
AutoSystemInfo::CheckForAtom() const
{
    int CPUInfo[4];
    const int GENUINE_INTEL_0 = 0x756e6547,
              GENUINE_INTEL_1 = 0x49656e69,
              GENUINE_INTEL_2 = 0x6c65746e;
    const int PLATFORM_MASK = 0x0fff3ff0;
    const int ATOM_PLATFORM_A = 0x0106c0, /* bonnell - extended model 1c, type 0, family code 6 */
              ATOM_PLATFORM_B = 0x020660, /* lincroft - extended model 26, type 0, family code 6 */
              ATOM_PLATFORM_C = 0x020670, /* saltwell - extended model 27, type 0, family code 6 */
              ATOM_PLATFORM_D = 0x030650, /* tbd - extended model 35, type 0, family code 6 */
              ATOM_PLATFORM_E = 0x030660, /* tbd - extended model 36, type 0, family code 6 */
              ATOM_PLATFORM_F = 0x030670; /* tbd - extended model 37, type 0, family code 6 */
    int platformSignature;

    get_cpuid(CPUInfo, 0);

    // See if CPU is ATOM HW. First check if CPU is genuine Intel.
    if( CPUInfo[1]==GENUINE_INTEL_0 &&
        CPUInfo[3]==GENUINE_INTEL_1 &&
        CPUInfo[2]==GENUINE_INTEL_2)
    {
        get_cpuid(CPUInfo, 1);
        // get platform signature
        platformSignature = CPUInfo[0];
        if((( PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_A) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_B) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_C) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_D) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_E) ||
            ((PLATFORM_MASK & platformSignature) == ATOM_PLATFORM_F))
        {
            return true;
        }

    }
    return false;
}